

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkPrintSubraphSizes(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar5->pArray[lVar6];
        if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
           (1 < (pNode->vFanouts).nSize)) {
          iVar3 = Abc_NodeIsExorType(pNode);
          if (iVar3 == 0) {
            piVar1 = (pNode->vFanins).pArray;
            ppvVar2 = pNode->pNtk->vObjs->pArray;
            iVar3 = Abc_ObjSugraphSize((Abc_Obj_t *)ppvVar2[*piVar1]);
            iVar4 = Abc_ObjSugraphSize((Abc_Obj_t *)ppvVar2[piVar1[1]]);
            printf("%d(%d) ",(ulong)(iVar3 + iVar4 + 1),(ulong)(uint)(pNode->vFanouts).nSize);
          }
        }
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar6 < pVVar5->nSize);
    }
    putchar(10);
    return 1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                ,0x767,"int Abc_NtkPrintSubraphSizes(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkPrintSubraphSizes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsExorType(pObj) )
            printf( "%d(%d) ", 1 + Abc_ObjSugraphSize(Abc_ObjFanin0(pObj)) + 
                Abc_ObjSugraphSize(Abc_ObjFanin1(pObj)), Abc_ObjFanoutNum(pObj) );
    printf( "\n" );
    return 1;
}